

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

bool __thiscall
QItemSelectionRange::intersects(QItemSelectionRange *this,QItemSelectionRange *other)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QItemSelectionRange *this_00;
  QItemSelectionRange *pQVar6;
  long in_FS_OFFSET;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  bool local_39;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QItemSelectionRange *)model((QItemSelectionRange *)0x82442f);
  pQVar6 = (QItemSelectionRange *)model((QItemSelectionRange *)0x82443e);
  if (this_00 == pQVar6) {
    iVar3 = top((QItemSelectionRange *)0x82445f);
    iVar4 = bottom((QItemSelectionRange *)0x82446d);
    if (iVar3 <= iVar4) {
      iVar3 = bottom((QItemSelectionRange *)0x824481);
      iVar4 = top((QItemSelectionRange *)0x82448f);
      if (iVar4 <= iVar3) {
        iVar3 = left((QItemSelectionRange *)0x8244ad);
        iVar4 = right((QItemSelectionRange *)0x8244bb);
        if (iVar3 <= iVar4) {
          iVar4 = right((QItemSelectionRange *)0x8244cf);
          iVar5 = left((QItemSelectionRange *)0x8244dd);
          if (iVar5 <= iVar4) {
            parent((QItemSelectionRange *)CONCAT44(iVar3,iVar4));
            parent((QItemSelectionRange *)CONCAT44(iVar3,iVar4));
            bVar2 = ::operator!=((QModelIndex *)CONCAT44(iVar3,iVar4),
                                 (QModelIndex *)
                                 CONCAT17(in_stack_ffffffffffffff8f,
                                          CONCAT16(in_stack_ffffffffffffff8e,
                                                   in_stack_ffffffffffffff88)));
            if (bVar2) {
              local_39 = false;
            }
            else {
              bVar2 = isValid(this_00);
              local_39 = false;
              if (bVar2) {
                local_39 = isValid(this_00);
              }
            }
            goto LAB_00824559;
          }
        }
        local_39 = false;
        goto LAB_00824559;
      }
    }
    local_39 = false;
  }
  else {
    local_39 = false;
  }
LAB_00824559:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_39;
}

Assistant:

bool QItemSelectionRange::intersects(const QItemSelectionRange &other) const
{
    // isValid() and parent() last since they are more expensive
    if (model() != other.model())
        return false;

    if (top() > other.bottom() || bottom() < other.top())
        return false;

    if (left() > other.right() || right() < other.left())
        return false;

    if (parent() != other.parent())
        return false;

    return isValid() && other.isValid();
}